

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O2

int accept_client(void)

{
  uint __fd;
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  char *__format;
  socklen_t sz;
  sockaddr_in in;
  sigset_t none;
  
  sz = 0x10;
  __fd = accept(cfg.listener_fd,(sockaddr *)&in,&sz);
  __stream = _stderr;
  if (__fd == 0xffffffff) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "accept: %s\n";
  }
  else {
    if ((cfg.verbose != 0) && (sz == 0x10)) {
      pcVar4 = inet_ntoa((in_addr)in.sin_addr.s_addr);
      fprintf(__stream,"connection fd %d from %s:%d\n",(ulong)__fd,pcVar4,
              (ulong)(ushort)(in.sin_port << 8 | in.sin_port >> 8));
    }
    uVar1 = fork();
    __stream = _stderr;
    if (uVar1 == 0xffffffff) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      __format = "fork: %s\n";
    }
    else {
      if (0 < (int)uVar1) {
        close(__fd);
        fprintf(_stderr,"forked pid %d\n",(ulong)uVar1);
        return 0;
      }
      if (uVar1 != 0) {
        __assert_fail("pid == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/onconnect.c"
                      ,0x9f,"int accept_client()");
      }
      close(cfg.listener_fd);
      close(cfg.signal_fd);
      close(cfg.epoll_fd);
      if (__fd != 3) {
        iVar2 = dup2(__fd,3);
        __stream = _stderr;
        if (iVar2 < 0) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          __format = "dup2: %s\n";
          goto LAB_0010171d;
        }
        close(__fd);
      }
      for (lVar5 = 0; lVar5 != 0x1c; lVar5 = lVar5 + 4) {
        signal(*(int *)((long)sigs + lVar5),(__sighandler_t)0x0);
      }
      sigemptyset((sigset_t *)&none);
      sigprocmask(2,(sigset_t *)&none,(sigset_t *)0x0);
      iVar2 = execv(*cfg.subprocess_argv,cfg.subprocess_argv);
      __stream = _stderr;
      if (iVar2 != -1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/onconnect.c"
                      ,0xc0,"int accept_client()");
      }
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      __format = "execv: %s\n";
    }
  }
LAB_0010171d:
  fprintf(__stream,__format,pcVar4);
  return -1;
}

Assistant:

int accept_client() {
  int fd, n, sc, rc = -1;
  pid_t pid;
  struct sockaddr_in in;
  socklen_t sz = sizeof(in);

  fd = accept(cfg.listener_fd,(struct sockaddr*)&in, &sz);
  if (fd == -1) {
    fprintf(stderr,"accept: %s\n", strerror(errno)); 
    goto done;
  }

  if (cfg.verbose && (sizeof(in)==sz)) {
    fprintf(stderr,"connection fd %d from %s:%d\n", fd,
    inet_ntoa(in.sin_addr), (int)ntohs(in.sin_port));
  }

  /* fork subprocess */
  pid = fork();

  if (pid == -1) {
    fprintf(stderr, "fork: %s\n", strerror(errno));
    goto done;
  }

  if (pid > 0) { /* parent */
    close(fd);
    fprintf(stderr, "forked pid %d\n", pid);
  } else {  /* child */
    assert(pid == 0);

    /* in the child, close the parent's descriptors except
     * for stdin, stdout, stderr and the new connection */
    close(cfg.listener_fd);
    close(cfg.signal_fd);
    close(cfg.epoll_fd);

    /* make the new connection fd 3, close original fd */
    if (fd != STDERR_FILENO+1) {      /* 3 */
      sc = dup2(fd, STDERR_FILENO+1);
      if (sc < 0) {
        fprintf(stderr, "dup2: %s\n", strerror(errno));
        goto done;
      }
      close(fd);
    }

    /* restore/unblock default signal handlers */
    for(n = 0; n < sizeof(sigs)/sizeof(*sigs); n++) {
      signal(sigs[n], SIG_DFL);
    }
    sigset_t none;
    sigemptyset(&none);
    sigprocmask(SIG_SETMASK, &none, NULL);

    sc = execv(cfg.subprocess_argv[0], cfg.subprocess_argv);
    if (sc == -1) {
      fprintf(stderr, "execv: %s\n", strerror(errno));
      goto done;
    }

    /* NOT REACHED */
    assert(0);
    goto done;

  }

  rc = 0;

 done:
  return rc;
}